

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::defineForthWords(Forth *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             ": catch catchbefore execute catchafter ; : abort -1 throw ; : evaluate evaluatestart noop evaluatestop ; : over    1 pick ; : nip     swap drop ; : tuck    swap over ; : 2over   3 pick 3 pick ; : 2swap   3 roll 3 roll ; : 2>r     swap >r >r ; : 2r>     r> r> swap ; : 2r@     r> r> 2dup >r >r swap ; : false   0 ; : true    -1 ; : 1- 1 - ; : cell+   1 cells + ; : char+   1+ ; : chars   ; : +!   dup >r @ + r> ! ; : negate   0 swap - ; : invert   true xor ; : ,    here  1 cells allot  ! ; : c,   here  1 chars allot  c! ; : <>    = invert ; : 0<    0 < ; : 0>    0 > ; : 0=    0 = ; : 0<>   0= invert ; : 2*   1 lshift ; : variable   create 0 , ; : ?  @ . ; : constant    create ,    does>  @ ; : 2constant   create , ,  does>  dup cell+ @ swap @ ; : 2VARIABLE ALIGN HERE 2 CELLS ALLOT CONSTANT ;  1 cells constant /cell  : decimal   10 base ! ; : hex       16 base ! ; : ]   true state ! ; : [   false state ! ; immediate : \' bl word find drop ; \' (lit)     constant \'(lit) : literal   \'(lit) , , ; immediate : 2literal swap \'(lit) , , \'(lit) , , ; immediate : [\']   \' \'(lit) , , ; immediate  : recurse     latest , ; immediate  : char     bl word char+ c@ ; : [char]   char \'(lit) , , ; immediate  : [DEFINED] BL WORD FIND NIP 0<> ; IMMEDIATE : [UNDEFINED] BL WORD FIND NIP 0= ; IMMEDIATE : MAX 2DUP > IF  ELSE SWAP THEN DROP ; : MIN 2DUP < IF  ELSE SWAP THEN DROP ; : SPACE BL EMIT ; : SPACES 0 MAX 0 ?DO SPACE LOOP ; : MOD /MOD drop ; : 2@ DUP CELL+ @ SWAP @ ; : 2! SWAP OVER ! CELL+ ! ; : DABS 2DUP SWAP DROP 0 < IF DNEGATE THEN ; : D. DUP >R DABS <# #S R> SIGN #> TYPE SPACE ; : U. 0 D. ; : U.R  >R 0 <# #S #> R> OVER - 0 MAX SPACES TYPE ; : D.R >R DUP >R DABS <# #S R> SIGN #>  R> OVER - 0 MAX SPACES TYPE ;  : MOVE ROT ROT 2DUP < IF ROT CMOVE> ELSE ROT CMOVE THEN ;  : WITHIN OVER - >R - R> U< ;   : BUFFER:  CREATE ALLOT ;  : ?dup       dup 0<> if dup then ; : abs        dup 0 < if negate then ; : max        2dup < if nip else drop then ; : min        2dup < if drop else nip then ; : space      bl emit ; : spaces     begin  dup 0> whi..." /* TRUNCATED STRING LITERAL */
             ,"");
  SetInput(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  interpret(this);
  return;
}

Assistant:

void defineForthWords() {
				auto line = forthDefinitions;
				SetInput( line );
				interpret();
		}